

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSCriticalSection.h
# Opt level: O0

void EnterCriticalSection(CRITICAL_SECTION *pCriticalSection)

{
  CRITICAL_SECTION *pCriticalSection_local;
  
  pthread_mutex_lock((pthread_mutex_t *)pCriticalSection);
  return;
}

Assistant:

inline void EnterCriticalSection(CRITICAL_SECTION* pCriticalSection)
{
	if (pthread_mutex_lock(pCriticalSection) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_WARNING_OSCRITICALSECTION(("EnterCriticalSection warning (%s) : %s"
			"(pCriticalSection=%#x)\n", 
			strtime_m(), 
			"pthread_mutex_lock failed. ", 
			pCriticalSection));
	}
}